

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.cpp
# Opt level: O2

void __thiscall
FIX::Message::Message
          (Message *this,message_order *headerOrder,message_order *trailerOrder,message_order *order
          ,string *string,DataDictionary *dataDictionary,bool validate)

{
  FieldMap::FieldMap(&this->super_FieldMap,order);
  (this->super_FieldMap)._vptr_FieldMap = (_func_int **)&PTR__Message_001fd438;
  Header::Header(&this->m_header,headerOrder);
  Trailer::Trailer(&this->m_trailer,trailerOrder);
  this->m_validStructure = true;
  setString(this,string,validate,dataDictionary,dataDictionary);
  return;
}

Assistant:

Message::Message(
    const message_order &headerOrder,
    const message_order &trailerOrder,
    const message_order &order,
    const std::string &string,
    const DataDictionary &dataDictionary,
    bool validate) EXCEPT(InvalidMessage)
    : FieldMap(order),
      m_header(headerOrder),
      m_trailer(trailerOrder),
      m_validStructure(true) {
  setString(string, validate, &dataDictionary, &dataDictionary);
}